

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase78::run(TestCase78 *this)

{
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StructSchema schema;
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> local_f8;
  Maybe<capnp::StructSchema::Field> local_90;
  Schema local_48;
  SchemaLoader loader;
  
  SchemaLoader::SchemaLoader(&loader);
  local_48.raw = (RawBrandedSchema *)(schemas::s_9e2e784c915329b6 + 0x48);
  Schema::getProto((Reader *)&local_f8,&local_48);
  local_90.ptr._0_8_ = SchemaLoader::load(&loader,(Reader *)&local_f8);
  schema = Schema::asStruct((Schema *)&local_90);
  name.content.size_ = 1;
  name.content.ptr = "";
  StructSchema::findFieldByName(&local_90,&schema,name);
  if (local_90.ptr.isSet == true) {
    local_f8.left.ptr.field_1._48_8_ = local_90.ptr.field_1._48_8_;
    local_f8.left.ptr.field_1._56_8_ = local_90.ptr.field_1._56_8_;
    local_f8.left.ptr.field_1.value.proto._reader.data =
         local_90.ptr.field_1.value.proto._reader.data;
    local_f8.left.ptr.field_1.value.proto._reader.pointers =
         local_90.ptr.field_1.value.proto._reader.pointers;
    local_f8.left.ptr.field_1.value.proto._reader.segment =
         local_90.ptr.field_1.value.proto._reader.segment;
    local_f8.left.ptr.field_1.value.proto._reader.capTable =
         local_90.ptr.field_1.value.proto._reader.capTable;
    local_f8.left.ptr.field_1.value.parent.super_Schema.raw =
         local_90.ptr.field_1.value.parent.super_Schema.raw;
    local_f8.left.ptr.field_1._8_8_ = local_90.ptr.field_1._8_8_;
  }
  local_f8.left.ptr.isSet = local_90.ptr.isSet;
  local_f8.result = (bool)(local_90.ptr.isSet ^ 1);
  local_f8.right = (None *)&kj::none;
  local_f8.op.content.ptr = " == ";
  local_f8.op.content.size_ = 5;
  if ((local_90.ptr.isSet != false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[56],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x54,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"\\\") == kj::none\", _kjCondition"
               ,(char (*) [56])"failed: expected schema.findFieldByName(\"\") == kj::none",&local_f8
              );
  }
  name_00.content.size_ = 4;
  name_00.content.ptr = "foo";
  StructSchema::findFieldByName(&local_90,&schema,name_00);
  if (local_90.ptr.isSet == true) {
    local_f8.left.ptr.field_1._48_8_ = local_90.ptr.field_1._48_8_;
    local_f8.left.ptr.field_1._56_8_ = local_90.ptr.field_1._56_8_;
    local_f8.left.ptr.field_1.value.proto._reader.data =
         local_90.ptr.field_1.value.proto._reader.data;
    local_f8.left.ptr.field_1.value.proto._reader.pointers =
         local_90.ptr.field_1.value.proto._reader.pointers;
    local_f8.left.ptr.field_1.value.proto._reader.segment =
         local_90.ptr.field_1.value.proto._reader.segment;
    local_f8.left.ptr.field_1.value.proto._reader.capTable =
         local_90.ptr.field_1.value.proto._reader.capTable;
    local_f8.left.ptr.field_1.value.parent.super_Schema.raw =
         local_90.ptr.field_1.value.parent.super_Schema.raw;
    local_f8.left.ptr.field_1._8_8_ = local_90.ptr.field_1._8_8_;
  }
  local_f8.left.ptr.isSet = local_90.ptr.isSet;
  local_f8.right = (None *)&kj::none;
  local_f8.op.content.ptr = anon_var_dwarf_43885;
  local_f8.op.content.size_ = 5;
  local_f8.result = local_90.ptr.isSet;
  if ((local_90.ptr.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[59],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x56,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"foo\\\") != kj::none\", _kjCondition"
               ,(char (*) [59])"failed: expected schema.findFieldByName(\"foo\") != kj::none",
               &local_f8);
  }
  name_01.content.size_ = 4;
  name_01.content.ptr = "bar";
  StructSchema::findFieldByName(&local_90,&schema,name_01);
  if (local_90.ptr.isSet == true) {
    local_f8.left.ptr.field_1._48_8_ = local_90.ptr.field_1._48_8_;
    local_f8.left.ptr.field_1._56_8_ = local_90.ptr.field_1._56_8_;
    local_f8.left.ptr.field_1.value.proto._reader.data =
         local_90.ptr.field_1.value.proto._reader.data;
    local_f8.left.ptr.field_1.value.proto._reader.pointers =
         local_90.ptr.field_1.value.proto._reader.pointers;
    local_f8.left.ptr.field_1.value.proto._reader.segment =
         local_90.ptr.field_1.value.proto._reader.segment;
    local_f8.left.ptr.field_1.value.proto._reader.capTable =
         local_90.ptr.field_1.value.proto._reader.capTable;
    local_f8.left.ptr.field_1.value.parent.super_Schema.raw =
         local_90.ptr.field_1.value.parent.super_Schema.raw;
    local_f8.left.ptr.field_1._8_8_ = local_90.ptr.field_1._8_8_;
  }
  local_f8.left.ptr.isSet = local_90.ptr.isSet;
  local_f8.right = (None *)&kj::none;
  local_f8.op.content.ptr = anon_var_dwarf_43885;
  local_f8.op.content.size_ = 5;
  local_f8.result = local_90.ptr.isSet;
  if ((local_90.ptr.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[59],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x57,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"bar\\\") != kj::none\", _kjCondition"
               ,(char (*) [59])"failed: expected schema.findFieldByName(\"bar\") != kj::none",
               &local_f8);
  }
  name_02.content.size_ = 7;
  name_02.content.ptr = "before";
  StructSchema::findFieldByName(&local_90,&schema,name_02);
  if (local_90.ptr.isSet == true) {
    local_f8.left.ptr.field_1._48_8_ = local_90.ptr.field_1._48_8_;
    local_f8.left.ptr.field_1._56_8_ = local_90.ptr.field_1._56_8_;
    local_f8.left.ptr.field_1.value.proto._reader.data =
         local_90.ptr.field_1.value.proto._reader.data;
    local_f8.left.ptr.field_1.value.proto._reader.pointers =
         local_90.ptr.field_1.value.proto._reader.pointers;
    local_f8.left.ptr.field_1.value.proto._reader.segment =
         local_90.ptr.field_1.value.proto._reader.segment;
    local_f8.left.ptr.field_1.value.proto._reader.capTable =
         local_90.ptr.field_1.value.proto._reader.capTable;
    local_f8.left.ptr.field_1.value.parent.super_Schema.raw =
         local_90.ptr.field_1.value.parent.super_Schema.raw;
    local_f8.left.ptr.field_1._8_8_ = local_90.ptr.field_1._8_8_;
  }
  local_f8.left.ptr.isSet = local_90.ptr.isSet;
  local_f8.right = (None *)&kj::none;
  local_f8.op.content.ptr = anon_var_dwarf_43885;
  local_f8.op.content.size_ = 5;
  local_f8.result = local_90.ptr.isSet;
  if ((local_90.ptr.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[62],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x58,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"before\\\") != kj::none\", _kjCondition"
               ,(char (*) [62])"failed: expected schema.findFieldByName(\"before\") != kj::none",
               &local_f8);
  }
  name_03.content.size_ = 6;
  name_03.content.ptr = "after";
  StructSchema::findFieldByName(&local_90,&schema,name_03);
  if (local_90.ptr.isSet == true) {
    local_f8.left.ptr.field_1._48_8_ = local_90.ptr.field_1._48_8_;
    local_f8.left.ptr.field_1._56_8_ = local_90.ptr.field_1._56_8_;
    local_f8.left.ptr.field_1.value.proto._reader.data =
         local_90.ptr.field_1.value.proto._reader.data;
    local_f8.left.ptr.field_1.value.proto._reader.pointers =
         local_90.ptr.field_1.value.proto._reader.pointers;
    local_f8.left.ptr.field_1.value.proto._reader.segment =
         local_90.ptr.field_1.value.proto._reader.segment;
    local_f8.left.ptr.field_1.value.proto._reader.capTable =
         local_90.ptr.field_1.value.proto._reader.capTable;
    local_f8.left.ptr.field_1.value.parent.super_Schema.raw =
         local_90.ptr.field_1.value.parent.super_Schema.raw;
    local_f8.left.ptr.field_1._8_8_ = local_90.ptr.field_1._8_8_;
  }
  local_f8.left.ptr.isSet = local_90.ptr.isSet;
  local_f8.right = (None *)&kj::none;
  local_f8.op.content.ptr = anon_var_dwarf_43885;
  local_f8.op.content.size_ = 5;
  local_f8.result = local_90.ptr.isSet;
  if ((local_90.ptr.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x59,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"after\\\") != kj::none\", _kjCondition"
               ,(char (*) [61])"failed: expected schema.findFieldByName(\"after\") != kj::none",
               &local_f8);
  }
  SchemaLoader::~SchemaLoader(&loader);
  return;
}

Assistant:

TEST(SchemaLoader, LoadUnnamedUnion) {
  SchemaLoader loader;

  StructSchema schema =
      loader.load(Schema::from<test::TestUnnamedUnion>().getProto()).asStruct();

  EXPECT_TRUE(schema.findFieldByName("") == kj::none);

  EXPECT_TRUE(schema.findFieldByName("foo") != kj::none);
  EXPECT_TRUE(schema.findFieldByName("bar") != kj::none);
  EXPECT_TRUE(schema.findFieldByName("before") != kj::none);
  EXPECT_TRUE(schema.findFieldByName("after") != kj::none);
}